

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_CreateSlice(Cba_Ntk_t *p,int iFon,Prs_Ntk_t *pNtk,int Range)

{
  int iVar1;
  int i;
  char *format;
  int NameId;
  int iFonNew;
  int iObj;
  int Range_local;
  Prs_Ntk_t *pNtk_local;
  int iFon_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_FonIsReal(iFon);
  if (iVar1 == 0) {
    __assert_fail("Cba_FonIsReal(iFon)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x596,"int Prs_CreateSlice(Cba_Ntk_t *, int, Prs_Ntk_t *, int)");
  }
  format = Cba_ManGetSliceName(p,iFon,Range);
  iVar1 = Cba_NtkNewStrId(p,format);
  p_local._4_4_ = Cba_NtkGetMap(p,iVar1);
  if (p_local._4_4_ == 0) {
    i = Cba_ObjAlloc(p,CBA_BOX_SLICE,1,1);
    Cba_ObjSetName(p,i,iVar1);
    Cba_ObjSetFinFon(p,i,0,iFon);
    p_local._4_4_ = Cba_ObjFon0(p,i);
    Cba_FonSetRange(p,p_local._4_4_,Range);
    Cba_FonSetName(p,p_local._4_4_,iVar1);
    Cba_NtkSetMap(p,iVar1,p_local._4_4_);
  }
  return p_local._4_4_;
}

Assistant:

int Prs_CreateSlice( Cba_Ntk_t * p, int iFon, Prs_Ntk_t * pNtk, int Range )
{
    int iObj, iFonNew, NameId;
    assert( Cba_FonIsReal(iFon) );
    // check existing slice
    NameId = Cba_NtkNewStrId( p, Cba_ManGetSliceName(p, iFon, Range) );
    iFonNew = Cba_NtkGetMap( p, NameId );
    if ( iFonNew )
        return iFonNew;
    // create slice
    iObj = Cba_ObjAlloc( p, CBA_BOX_SLICE, 1, 1 );
    Cba_ObjSetName( p, iObj, NameId );
    Cba_ObjSetFinFon( p, iObj, 0, iFon );
    iFonNew = Cba_ObjFon0(p, iObj);
    Cba_FonSetRange( p, iFonNew, Range );
    Cba_FonSetName( p, iFonNew, NameId );
    Cba_NtkSetMap( p, NameId, iFonNew );
    return iFonNew;        
}